

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.c
# Opt level: O2

int ToUpperCase(uint8_t *p)

{
  byte bVar1;
  int iVar2;
  
  bVar1 = *p;
  if (bVar1 < 0xc0) {
    iVar2 = 1;
    if ((byte)(bVar1 + 0x9f) < 0x1a) {
      *p = bVar1 & 0x5f;
      return iVar2;
    }
  }
  else {
    if (bVar1 < 0xe0) {
      p[1] = p[1] ^ 0x20;
      return 2;
    }
    p[2] = p[2] ^ 5;
    iVar2 = 3;
  }
  return iVar2;
}

Assistant:

static int ToUpperCase(uint8_t* p) {
  if (p[0] < 0xC0) {
    if (p[0] >= 'a' && p[0] <= 'z') {
      p[0] ^= 32;
    }
    return 1;
  }
  /* An overly simplified uppercasing model for UTF-8. */
  if (p[0] < 0xE0) {
    p[1] ^= 32;
    return 2;
  }
  /* An arbitrary transform for three byte characters. */
  p[2] ^= 5;
  return 3;
}